

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O1

int pm_find_default_device(char *pattern,int is_input)

{
  bool bVar1;
  char *pcVar2;
  PmDeviceInfo *pPVar3;
  char *pcVar4;
  int iVar5;
  int id;
  char *local_38;
  
  pcVar2 = strstr(pattern,", ");
  if (pcVar2 == (char *)0x0) {
    local_38 = "";
    pcVar2 = pattern;
  }
  else {
    *pcVar2 = '\0';
    pcVar2 = pcVar2 + 2;
    local_38 = pattern;
  }
  if (pm_descriptor_index < 1) {
    iVar5 = -1;
  }
  else {
    id = 0;
    iVar5 = -1;
    do {
      pPVar3 = Pm_GetDeviceInfo(id);
      if (((pPVar3->input == is_input) &&
          (pcVar4 = strstr(pPVar3->name,pcVar2), pcVar4 != (char *)0x0)) &&
         (pcVar4 = strstr(pPVar3->interf,local_38), pcVar4 != (char *)0x0)) {
        bVar1 = false;
        iVar5 = id;
      }
      else {
        bVar1 = true;
      }
    } while ((bVar1) && (id = id + 1, id < pm_descriptor_index));
  }
  return iVar5;
}

Assistant:

int pm_find_default_device(char *pattern, int is_input)
{
    int id = pmNoDevice;
    int i;
    /* first parse pattern into name, interf parts */
    char *interf_pref = ""; /* initially assume it is not there */
    char *name_pref = strstr(pattern, ", ");

    if (name_pref) { /* found separator, adjust the pointer */
        interf_pref = pattern;
        name_pref[0] = 0;
        name_pref += 2;
    } else {
        name_pref = pattern; /* whole string is the name pattern */
    }
    for (i = 0; i < pm_descriptor_index; i++) {
        const PmDeviceInfo *info = Pm_GetDeviceInfo(i);
        if (info->input == is_input &&
            strstr(info->name, name_pref) &&
            strstr(info->interf, interf_pref)) {
            id = i;
            break;
        }
    }    
    return id;
}